

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O1

void libxml_domnode_tim_sort(xmlNodePtr *dst,size_t size)

{
  size_t sVar1;
  xmlNodePtr *ppxVar2;
  xmlNodePtr *ppxVar3;
  xmlNodePtr *ppxVar4;
  xmlNodePtr *ppxVar5;
  bool bVar6;
  long lVar7;
  TEMP_STORAGE_T *pTVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  size_t stack_curr;
  size_t curr;
  TEMP_STORAGE_T _store;
  TIM_SORT_RUN_T run_stack [128];
  xmlNodePtr *local_870;
  size_t local_868 [2];
  TEMP_STORAGE_T local_858;
  size_t local_848;
  TEMP_STORAGE_T *pTStack_840;
  TIM_SORT_RUN_T local_838;
  ulong local_820;
  
  local_868[0] = 0;
  local_868[1] = 0;
  if (1 < size) {
    local_870 = dst;
    if (size < 0x40) {
      libxml_domnode_binary_insertion_sort_start(dst,1,size);
      return;
    }
    lVar7 = 0x3f;
    if (size != 0) {
      for (; size >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    bVar12 = 0x3a - ((byte)lVar7 ^ 0x3f);
    local_848 = (size_t)(int)(((int)(size >> (bVar12 & 0x3f)) + 1) -
                             (uint)((~(-1L << (bVar12 & 0x3f)) & size) == 0));
    local_858.alloc = 0;
    local_858.storage = (xmlNodePtr *)0x0;
    iVar9 = PUSH_NEXT(dst,size,&local_858,local_848,&local_838,local_868,local_868 + 1);
    if ((iVar9 != 0) &&
       (iVar9 = PUSH_NEXT(local_870,size,&local_858,local_848,&local_838,local_868,local_868 + 1),
       iVar9 != 0)) {
LAB_001bb560:
      iVar9 = PUSH_NEXT(local_870,size,&local_858,local_848,&local_838,local_868,local_868 + 1);
      if (iVar9 != 0) {
        while( true ) {
          uVar13 = (uint)local_868[0];
          if ((int)uVar13 < 2) break;
          if (uVar13 == 2) {
            bVar6 = local_820 < local_838.length;
          }
          else {
            uVar10 = (ulong)(uVar13 & 0x7fffffff);
            bVar6 = (&pTStack_840)[uVar10 * 2] < (TEMP_STORAGE_T *)(&local_858)[uVar10].storage &&
                    (ulong)((long)&((TEMP_STORAGE_T *)(&local_858)[uVar10].storage)->alloc +
                           (long)&(&pTStack_840)[uVar10 * 2]->alloc) < local_868[uVar10 * 2 + 1];
          }
          uVar10 = local_868[0];
          if (bVar6) break;
          do {
            iVar9 = (int)uVar10;
            if (iVar9 < 2) {
LAB_001bb661:
              uVar14 = uVar10;
              bVar6 = false;
            }
            else {
              if (iVar9 == 2) {
                sVar1 = local_820 + local_838.length;
                if ((sVar1 == size) || (local_838.length <= local_820)) {
                  libxml_domnode_tim_sort_merge(local_870,&local_838,2,&local_858);
                  local_838.length = sVar1;
                  uVar10 = 1;
                }
                else {
                  uVar10 = 2;
                }
                goto LAB_001bb661;
              }
              uVar11 = uVar10 & 0xffffffff;
              ppxVar3 = (xmlNodePtr *)local_868[uVar11 * 2 + 1];
              ppxVar4 = (&local_858)[uVar11].storage;
              if (iVar9 < 4) {
                bVar6 = false;
              }
              else {
                bVar6 = (&local_870)[uVar11 * 2] <= (xmlNodePtr *)((long)ppxVar3 + (long)ppxVar4);
              }
              uVar14 = (ulong)(iVar9 - 1U);
              ppxVar5 = (xmlNodePtr *)(&local_838)[uVar14].length;
              ppxVar2 = (xmlNodePtr *)((long)ppxVar5 + (long)ppxVar4);
              if ((ppxVar2 < ppxVar3 && !bVar6) && (ppxVar5 < ppxVar4)) goto LAB_001bb661;
              if ((ppxVar2 < ppxVar3 && !bVar6) || (ppxVar4 <= ppxVar5)) {
                libxml_domnode_tim_sort_merge(local_870,&local_838,iVar9,&local_858);
                (&local_858)[uVar11].storage = ppxVar2;
              }
              else {
                pTStack_840 = &local_858 + uVar11;
                libxml_domnode_tim_sort_merge(local_870,&local_838,iVar9 - 1U,&local_858);
                local_868[uVar11 * 2 + 1] = (long)ppxVar4 + (long)ppxVar3;
                pTVar8 = pTStack_840;
                ppxVar3 = (xmlNodePtr *)(&local_838)[uVar14].length;
                pTStack_840->alloc = (&local_838)[uVar14].start;
                pTVar8->storage = ppxVar3;
              }
              bVar6 = true;
            }
            uVar10 = uVar14;
          } while (bVar6);
          local_868[0] = (long)(int)uVar14;
        }
        goto LAB_001bb560;
      }
    }
  }
  return;
}

Assistant:

void TIM_SORT(SORT_TYPE *dst, const size_t size) {
  size_t minrun;
  TEMP_STORAGE_T _store, *store;
  TIM_SORT_RUN_T run_stack[TIM_SORT_STACK_SIZE];
  size_t stack_curr = 0;
  size_t curr = 0;

  /* don't bother sorting an array of size 1 */
  if (size <= 1) {
    return;
  }

  if (size < 64) {
    BINARY_INSERTION_SORT(dst, size);
    return;
  }

  /* compute the minimum run length */
  minrun = compute_minrun(size);
  /* temporary storage for merges */
  store = &_store;
  store->alloc = 0;
  store->storage = NULL;

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  while (1) {
    if (!CHECK_INVARIANT(run_stack, stack_curr)) {
      stack_curr = TIM_SORT_COLLAPSE(dst, run_stack, stack_curr, store, size);
      continue;
    }

    if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
      return;
    }
  }
}